

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RS232Port.h
# Opt level: O3

int ReadAllRS232Port(RS232PORT *pRS232Port,uint8 *readbuf,int readbuflen)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  uint uVar4;
  ulong uVar5;
  
  if (pRS232Port->DevType - 1U < 4) {
    if (0 < readbuflen) {
      iVar1 = pRS232Port->s;
      uVar5 = 0;
      do {
        sVar3 = recv(iVar1,readbuf + uVar5,(long)(readbuflen - (int)uVar5),0);
        iVar2 = (int)sVar3;
        if (iVar2 < 0) {
          return 1;
        }
        if (iVar2 == 0) {
          return 2;
        }
        uVar4 = (int)uVar5 + iVar2;
        uVar5 = (ulong)uVar4;
      } while ((int)uVar4 < readbuflen);
    }
  }
  else {
    if (pRS232Port->DevType != 0) {
      return 1;
    }
    if (readbuflen != 0) {
      iVar1 = *(int *)&pRS232Port->hDev;
      uVar5 = 0;
      do {
        sVar3 = read(iVar1,readbuf + uVar5,(ulong)(uint)(readbuflen - (int)uVar5));
        iVar2 = (int)sVar3;
        if (iVar2 < 0) {
          return 1;
        }
        if (iVar2 == 0) {
          return 2;
        }
        uVar4 = (int)uVar5 + iVar2;
        uVar5 = (ulong)uVar4;
      } while (uVar4 < (uint)readbuflen);
    }
  }
  return 0;
}

Assistant:

inline int ReadAllRS232Port(RS232PORT* pRS232Port, uint8* readbuf, int readbuflen)
{
	switch (pRS232Port->DevType)
	{
	case TCP_CLIENT_TYPE_RS232PORT:
	case TCP_SERVER_TYPE_RS232PORT:
	case UDP_CLIENT_TYPE_RS232PORT:
	case UDP_SERVER_TYPE_RS232PORT:
		return recvall(pRS232Port->s, (char*)readbuf, readbuflen);
	case LOCAL_TYPE_RS232PORT:
		return ReadAllComputerRS232Port(pRS232Port->hDev, readbuf, (int)readbuflen);
	default:
		PRINT_DEBUG_ERROR_RS232PORT(("ReadAllRS232Port error (%s) : %s"
			"(pRS232Port=%#x, readbuf=%#x, readbuflen=%d)\n", 
			strtime_m(), 
			"Invalid device type. ", 
			pRS232Port, readbuf, readbuflen));
		return EXIT_FAILURE;
	}
}